

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  iterator pos;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_28;
  
  local_28.m_ = this->elements_;
  InnerMap::
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::SearchFrom(&local_28,(local_28.m_)->index_of_first_non_null_);
  if (local_28.node_ != (Node *)0x0) {
    do {
      pos.it_.m_ = local_28.m_;
      pos.it_.node_ = local_28.node_;
      pos.it_.bucket_index_ = local_28.bucket_index_;
      erase((iterator *)&local_28,this,pos);
    } while (local_28.node_ != (Node *)0x0);
  }
  return;
}

Assistant:

void clear() { erase(begin(), end()); }